

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_nil(FuncState *fs,int from,int n)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  if (fs->lasttarget < fs->pc) {
    puVar3 = fs->f->code + (long)fs->pc + -1;
  }
  else {
    puVar3 = &previousinstruction_invalidinstruction;
  }
  uVar1 = *puVar3;
  if ((uVar1 & 0x7f) == 8) {
    iVar6 = n + from;
    uVar7 = uVar1 >> 7 & 0xff;
    uVar4 = uVar1 >> 0x10 & 0xff;
    if ((from <= (int)(uVar7 + uVar4 + 1) && (int)uVar7 <= from) ||
       (bVar2 = true, (int)uVar7 <= iVar6 && from <= (int)uVar7)) {
      iVar8 = n + from;
      iVar5 = uVar4 + uVar7;
      if ((int)uVar7 < from) {
        from = uVar7;
      }
      if (iVar5 < iVar6) {
        iVar5 = iVar8 + 0xff;
      }
      *puVar3 = (iVar5 - from & 0xffU) << 0x10 | (from & 0xffU) << 7 | uVar1 & 0xff008008;
      bVar2 = false;
    }
    if (!bVar2) {
      return;
    }
  }
  luaK_code(fs,n * 0x10000 - 0xfff8U | from << 7);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  int l = from + n - 1;  /* last register to set nil */
  Instruction *previous = previousinstruction(fs);
  if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
    int pfrom = GETARG_A(*previous);  /* get previous range */
    int pl = pfrom + GETARG_B(*previous);
    if ((pfrom <= from && from <= pl + 1) ||
        (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
      if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
      if (pl > l) l = pl;  /* l = max(l, pl) */
      SETARG_A(*previous, from);
      SETARG_B(*previous, l - from);
      return;
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}